

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity.c
# Opt level: O2

void unittest_scan(char *folder_path,unittest_data *data)

{
  _Bool _Var1;
  int iVar2;
  DIR *ref;
  char *pcVar3;
  char *path;
  char *pcVar4;
  gravity_compiler_t *compiler;
  gravity_closure_t *closure;
  gravity_vm *vm;
  uint uVar5;
  gravity_value_t v1;
  size_t size;
  size_t local_f8;
  gravity_delegate_t local_f0;
  
  ref = directory_init(folder_path);
  if (ref != (DIR *)0x0) {
    while (pcVar3 = directory_read(ref,(char *)0x0), pcVar3 != (char *)0x0) {
      path = file_buildpath(pcVar3,folder_path);
      _Var1 = is_directory(path);
      if (_Var1) {
        iVar2 = strcmp(pcVar3,"disabled");
        if (iVar2 != 0) {
          unittest_scan(path,data);
        }
      }
      else {
        pcVar4 = strstr(path,".gravity");
        if (pcVar4 != (char *)0x0) {
          pcVar4 = strstr(path,"/fuzzy/");
          data->is_fuzzy = pcVar4 != (char *)0x0;
          local_f8 = 0;
          pcVar4 = file_read(path,&local_f8);
          if (pcVar4 == (char *)0x0) {
            __assert_fail("source_code",
                          "/workspace/llm4binary/github/license_c_cmakelists/marcobambini[P]gravity/src/cli/gravity.c"
                          ,0xc6,"void unittest_scan(const char *, unittest_data *)");
          }
          uVar5 = data->ncount + 1;
          data->ncount = uVar5;
          data->processed = false;
          printf("\n%d\tTest file: %s\n",(ulong)uVar5,pcVar3);
          printf("\tTest path: %s\n");
          free(path);
          memset(&local_f0.report_null_errors,0,0xb8);
          local_f0.error_callback = unittest_error;
          local_f0.unittest_callback = unittest_callback;
          local_f0.loadfile_callback = unittest_read;
          local_f0.xdata = data;
          compiler = gravity_compiler_create(&local_f0);
          closure = gravity_compiler_run(compiler,pcVar4,local_f8,0,false,false);
          vm = gravity_vm_new(&local_f0);
          gravity_compiler_transfer(compiler,vm);
          gravity_compiler_free(compiler);
          if ((closure != (gravity_closure_t *)0x0) &&
             (_Var1 = gravity_vm_runmain(vm,closure), _Var1)) {
            data->processed = true;
            v1 = gravity_vm_result(vm);
            if ((data->is_fuzzy != false) ||
               (_Var1 = gravity_value_equals(v1,data->expected_value), _Var1)) {
              data->nsuccess = data->nsuccess + 1;
              pcVar3 = "\tSUCCESS";
            }
            else {
              data->nfailure = data->nfailure + 1;
              pcVar3 = "\tFAILURE";
            }
            puts(pcVar3);
            gravity_value_free((gravity_vm *)0x0,data->expected_value);
          }
          gravity_vm_free(vm);
          if (data->processed == false) {
            data->nsuccess = data->nsuccess + 1;
            puts("\tSUCCESS");
          }
        }
      }
    }
  }
  return;
}

Assistant:

static void unittest_scan (const char *folder_path, unittest_data *data) {
    DIRREF dir = directory_init(folder_path);
    if (!dir) return;
    #ifdef WIN32
    char outbuffer[MAX_PATH];
    #else
    char *outbuffer = NULL;
    #endif
    const char *target_file;
    while ((target_file = directory_read(dir, outbuffer))) {
        
        // if file is a folder then start recursion
        const char *full_path = file_buildpath(target_file, folder_path);
        if (is_directory(full_path)) {
            // skip disabled folder
            if (strcmp(target_file, "disabled") == 0) continue;
            unittest_scan(full_path, data);
            continue;
        }
        
        // test only files with a .gravity extension
        if (strstr(full_path, ".gravity") == NULL) continue;
        data->is_fuzzy = (strstr(full_path, "/fuzzy/") != NULL);
        
        // load source code
        size_t size = 0;
        const char *source_code = file_read(full_path, &size);
        assert(source_code);
        
        // start unit test
        unittest_init(target_file, data);
        
        // compile and run source code
        printf("\n%d\tTest file: %s\n", data->ncount, target_file);
        printf("\tTest path: %s\n", full_path);
        mem_free(full_path);
        
        // initialize compiler and delegates
        gravity_delegate_t delegate = {
            .xdata = (void *)data,
            .error_callback = unittest_error,
            .unittest_callback = unittest_callback,
            .loadfile_callback = unittest_read
        };
        
        gravity_compiler_t *compiler = gravity_compiler_create(&delegate);
        gravity_closure_t *closure = gravity_compiler_run(compiler, source_code, size, 0, false, false);
        gravity_vm *vm = gravity_vm_new(&delegate);
        gravity_compiler_transfer(compiler, vm);
        gravity_compiler_free(compiler);
        
        if (closure) {
            if (gravity_vm_runmain(vm, closure)) {
                data->processed = true;
                gravity_value_t result = gravity_vm_result(vm);
                if (data->is_fuzzy || gravity_value_equals(result, data->expected_value)) {
                    ++data->nsuccess;
                    printf("\tSUCCESS\n");
                } else {
                    ++data->nfailure;
                    printf("\tFAILURE\n");
                }
                gravity_value_free(NULL, data->expected_value);
            }
        }
        gravity_vm_free(vm);
        
        // case for empty files or simple declarations test
        if (!data->processed) {
            ++data->nsuccess;
            printf("\tSUCCESS\n");
        }
        
        // cleanup unitest
        unittest_cleanup(target_file, data);
    }
}